

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_dual.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_dual::save
          (session_dual *this,session_interface *session,string *data,time_t timeout,bool isnew,
          bool on_server)

{
  ulong uVar1;
  element_type *peVar2;
  char *pcVar3;
  element_type *peVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  byte in_R8B;
  byte in_R9B;
  string cookie;
  session_interface *in_stack_ffffffffffffffa8;
  string local_48 [38];
  byte local_22;
  byte local_21;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((local_22 == 0) && (uVar1 = std::__cxx11::string::size(), uVar1 <= *(ulong *)(in_RDI + 0x30)))
  {
    session_interface::get_session_cookie_abi_cxx11_(in_stack_ffffffffffffffa8);
    uVar1 = std::__cxx11::string::empty();
    if (((uVar1 & 1) == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_48), *pcVar3 == 'I')) {
      peVar2 = std::
               __shared_ptr_access<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x43d882);
      (*(peVar2->super_session_api)._vptr_session_api[2])(peVar2,local_10);
    }
    peVar4 = std::
             __shared_ptr_access<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::sessions::session_cookies,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x43d8bf);
    (**(peVar4->super_session_api)._vptr_session_api)
              (peVar4,local_10,local_18,local_20,(ulong)(local_21 & 1),0);
    std::__cxx11::string::~string(local_48);
    return;
  }
  peVar2 = std::
           __shared_ptr_access<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::sessions::session_sid,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x43d808);
  (**(peVar2->super_session_api)._vptr_session_api)
            (peVar2,local_10,local_18,local_20,(ulong)(local_21 & 1),1);
  return;
}

Assistant:

void session_dual::save(session_interface &session,string const &data,time_t timeout,bool isnew,bool on_server)
{
	if(on_server || data.size() > data_size_limit_) {
		server_->save(session,data,timeout,isnew,true);
	}
	else {
		std::string cookie=session.get_session_cookie();
		if(!cookie.empty() && cookie[0]=='I') {
			server_->clear(session);
		}
		client_->save(session,data,timeout,isnew,false);
	}
}